

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O0

void __thiscall client::mini_xml_node_printer::operator()(mini_xml_node_printer *this,string *text)

{
  ostream *poVar1;
  string *text_local;
  mini_xml_node_printer *this_local;
  
  tab(this->indent + 4);
  poVar1 = std::operator<<((ostream *)&std::cout,"text: \"");
  poVar1 = std::operator<<(poVar1,(string *)text);
  poVar1 = std::operator<<(poVar1,'\"');
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void operator()(std::string const& text) const
        {
            tab(indent+tabsize);
            std::cout << "text: \"" << text << '"' << std::endl;
        }